

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

void CPP::WriteInitialization::addInitializer
               (Item *item,QString *name,int column,QString *value,QString *directive,
               bool translatable)

{
  QChar QVar1;
  QTextStream *pQVar2;
  long in_FS_OFFSET;
  QStringView QVar3;
  QStringView local_78;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((value->d).size != 0) {
    local_58.size = 0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_68 = 0xaaaaaaaa;
    uStack_64 = 0xaaaaaaaa;
    uStack_60 = 0xaaaaaaaa;
    uStack_5c = 0xaaaaaaaa;
    QTextStream::QTextStream((QTextStream *)&local_68,&local_58,3);
    pQVar2 = (QTextStream *)
             QTextStream::operator<<((QTextStream *)&local_68,(QString *)language::derefPointer);
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,"set");
    QVar1.ucs = QChar::toUpper((uint)(ushort)*(name->d).ptr);
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,QVar1);
    local_78.m_data = (name->d).ptr;
    local_78.m_size = (name->d).size;
    QVar3 = QStringView::mid(&local_78,1,-1);
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,QVar3);
    QTextStream::operator<<(pQVar2,'(');
    if (-1 < column) {
      pQVar2 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_68,column);
      QTextStream::operator<<(pQVar2,", ");
    }
    pQVar2 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_68,value);
    QTextStream::operator<<(pQVar2,");");
    Item::addSetter(item,(QString *)&local_58,directive,translatable);
    QTextStream::~QTextStream((QTextStream *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::addInitializer(Item *item, const QString &name,
                                         int column, const QString &value,
                                         const QString &directive, bool translatable)
{
    if (!value.isEmpty()) {
        QString setter;
        QTextStream str(&setter);
        str << language::derefPointer << "set" << name.at(0).toUpper() << QStringView{name}.mid(1) << '(';
        if (column >= 0)
            str << column << ", ";
        str << value << ");";
        item->addSetter(setter, directive, translatable);
    }
}